

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O2

int ctemplate_htmlparser::htmlparser_attr_type(htmlparser_ctx *ctx)

{
  char cVar1;
  int iVar2;
  int iVar3;
  meta_redirect_type_enum mVar4;
  char *pcVar5;
  char *__s2;
  
  iVar2 = htmlparser_in_attr(ctx);
  if (iVar2 == 0) {
    return 0;
  }
  pcVar5 = ctx->attr;
  iVar2 = 2;
  switch(ctx->attr[0]) {
  case 'a':
    iVar3 = strcmp(pcVar5,"action");
    if (iVar3 == 0) {
      return 2;
    }
    __s2 = "archive";
    break;
  case 'b':
    __s2 = "background";
    break;
  case 'c':
    iVar3 = strcmp(pcVar5,"cite");
    if (iVar3 == 0) {
      return 2;
    }
    iVar3 = strcmp(pcVar5,"classid");
    if (iVar3 == 0) {
      return 2;
    }
    __s2 = "codebase";
    break;
  case 'd':
    iVar3 = strcmp(pcVar5,"data");
    if (iVar3 == 0) {
      return 2;
    }
    __s2 = "dynsrc";
    break;
  default:
    goto switchD_001334ed_caseD_65;
  case 'h':
    __s2 = "href";
    break;
  case 'l':
    __s2 = "longdesc";
    break;
  case 'o':
    if (ctx->attr[1] == 'n') {
      return 3;
    }
    goto switchD_001334ed_caseD_65;
  case 's':
    __s2 = "src";
    break;
  case 'u':
    __s2 = "usemap";
  }
  iVar3 = strcmp(pcVar5,__s2);
  if (iVar3 != 0) {
switchD_001334ed_caseD_65:
    iVar2 = strcmp(pcVar5,"style");
    if (iVar2 == 0) {
      iVar2 = 4;
    }
    else {
      cVar1 = ctx->tag[0];
      pcVar5 = htmlparser_attr(ctx);
      if ((((cVar1 != '\0') && (iVar2 = strcmp(ctx->tag,"meta"), pcVar5 != (char *)0x0)) &&
          (iVar2 == 0)) && (iVar2 = strcmp(pcVar5,"content"), iVar2 == 0)) {
        pcVar5 = htmlparser_value(ctx);
        mVar4 = meta_redirect_type(pcVar5);
        if (mVar4 != META_REDIRECT_TYPE_NONE) {
          return 2;
        }
      }
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int htmlparser_attr_type(htmlparser_ctx *ctx)
{
    if (!htmlparser_in_attr(ctx))
        return HTMLPARSER_ATTR_NONE;

    if (is_js_attribute(ctx->attr))
        return HTMLPARSER_ATTR_JS;

    if (is_uri_attribute(ctx->attr))
        return HTMLPARSER_ATTR_URI;

    if (is_style_attribute(ctx->attr))
        return HTMLPARSER_ATTR_STYLE;

    const char* tag = htmlparser_tag(ctx);
    const char* attr = htmlparser_attr(ctx);

    /* Special logic to handle meta redirect type tags. */
    if (tag && strcmp(tag, "meta") == 0 &&
        attr && strcmp(attr, "content") == 0) {

      const char* value = htmlparser_value(ctx);
      meta_redirect_type_enum redirect_type = meta_redirect_type(value);

      if (redirect_type == META_REDIRECT_TYPE_URL ||
          redirect_type == META_REDIRECT_TYPE_URL_START)
        return HTMLPARSER_ATTR_URI;
    }

    return HTMLPARSER_ATTR_REGULAR;
}